

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindProgramCommand.cxx
# Opt level: O0

bool __thiscall
cmFindProgramHelper::CheckDirectoryForName(cmFindProgramHelper *this,string *path,string *name)

{
  bool bVar1;
  ulong uVar2;
  char *str2;
  string local_68;
  reference local_48;
  string *ext;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string *name_local;
  string *path_local;
  cmFindProgramHelper *this_local;
  
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->Extensions);
  ext = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end(&this->Extensions);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&ext);
    if (!bVar1) {
      return false;
    }
    local_48 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      str2 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::StringEndsWith(name,str2);
      if (!bVar1) goto LAB_00357632;
    }
    else {
LAB_00357632:
      std::__cxx11::string::operator=((string *)&this->TestNameExt,(string *)name);
      std::__cxx11::string::operator+=((string *)&this->TestNameExt,(string *)local_48);
      cmsys::SystemTools::CollapseFullPath(&local_68,&this->TestNameExt,path);
      std::__cxx11::string::operator=((string *)&this->TestPath,(string *)&local_68);
      std::__cxx11::string::~string((string *)&local_68);
      bVar1 = cmsys::SystemTools::FileExists(&this->TestPath,true);
      if (bVar1) {
        std::__cxx11::string::operator=((string *)&this->BestPath,(string *)&this->TestPath);
        return true;
      }
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool CheckDirectoryForName(std::string const& path, std::string const& name)
  {
    for (std::string const& ext : this->Extensions) {
      if (!ext.empty() && cmSystemTools::StringEndsWith(name, ext.c_str())) {
        continue;
      }
      this->TestNameExt = name;
      this->TestNameExt += ext;
      this->TestPath =
        cmSystemTools::CollapseFullPath(this->TestNameExt, path);

      if (cmSystemTools::FileExists(this->TestPath, true)) {
        this->BestPath = this->TestPath;
        return true;
      }
    }
    return false;
  }